

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.h
# Opt level: O0

void __thiscall SynBase::SynBase(SynBase *this,uint typeID,Lexeme *begin,Lexeme *end)

{
  char *local_50;
  char *local_40;
  Lexeme *end_local;
  Lexeme *begin_local;
  uint typeID_local;
  SynBase *this_local;
  
  this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002d0a80;
  this->typeID = typeID;
  this->begin = begin;
  this->end = end;
  if (begin == (Lexeme *)0x0) {
    local_40 = (char *)0x0;
  }
  else {
    local_40 = begin->pos;
  }
  if (end == (Lexeme *)0x0) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = end->pos + end->length;
  }
  InplaceStr::InplaceStr(&this->pos,local_40,local_50);
  this->next = (SynBase *)0x0;
  this->listed = false;
  this->isInternal = false;
  return;
}

Assistant:

SynBase(unsigned typeID, Lexeme *begin, Lexeme *end): typeID(typeID), begin(begin), end(end), pos(begin ? begin->pos : 0, end ? end->pos + end->length : 0), next(0), listed(false), isInternal(false)
	{
	}